

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNRand.cpp
# Opt level: O1

void __thiscall NaPNRandomGen::set_uniform_distrib(NaPNRandomGen *this,NaReal *fMin,NaReal *fMax)

{
  int iVar1;
  uint uVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  NaPetriNode::check_tunable((NaPetriNode *)this);
  if (((fMax != (NaReal *)0x0) && (fMin != (NaReal *)0x0)) &&
     ((this->super_NaPNGenerator).pUnit != (NaUnit *)0x0)) {
    iVar1 = (*(((this->super_NaPNGenerator).pUnit)->super_NaLogging)._vptr_NaLogging[9])();
    if (iVar1 != 0) {
      uVar4 = 0;
      do {
        NaRandomSequence::SetDistribution(this->pRandGen,rdUniform,(uint)uVar4);
        NaRandomSequence::SetUniformParams(this->pRandGen,fMin[uVar4],fMax[uVar4],(uint)uVar4);
        uVar4 = uVar4 + 1;
        uVar2 = (*(((this->super_NaPNGenerator).pUnit)->super_NaLogging)._vptr_NaLogging[9])();
      } while (uVar4 < uVar2);
    }
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaPNRandomGen::set_uniform_distrib (const NaReal* fMin, const NaReal* fMax)
{
  check_tunable();

  if(NULL == pUnit || NULL == fMin || NULL == fMax)
    throw(na_null_pointer);

  // Setup distribution parameters
  for(unsigned i = 0; i < pUnit->InputDim(); ++i)
    {
      pRandGen->SetDistribution(rdUniform, i);
      pRandGen->SetUniformParams(fMin[i], fMax[i], i);
    }
}